

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O3

ggml_tensor * __thiscall llm_graph_context::build_inp_pos_bucket_enc(llm_graph_context *this)

{
  llama_hparams *plVar1;
  tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_> tVar2;
  long lVar3;
  __uniq_ptr_impl<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> local_20;
  
  plVar1 = this->hparams;
  tVar2.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
  super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       operator_new(0x18);
  *(undefined ***)
   tVar2.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
   super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl = &PTR__llm_graph_input_i_00285ab0
  ;
  *(long *)((long)tVar2.
                  super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8) = 0;
  *(llama_hparams **)
   ((long)tVar2.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
          .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x10) = plVar1;
  lVar3 = ggml_new_tensor_2d(this->ctx0,0x1a,(long)this->n_tokens);
  *(long *)((long)tVar2.
                  super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8) = lVar3;
  ggml_set_input(lVar3);
  local_20._M_t.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
       (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       tVar2.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
       super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>,std::allocator<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>>>
  ::emplace_back<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>>
            ((vector<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>,std::allocator<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>>>
              *)&((this->res)._M_t.
                  super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>
                  .super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->inputs,
             (unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)&local_20);
  if ((_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
      local_20._M_t.
      super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
      super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl != (llm_graph_input_i *)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                          .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8))();
  }
  return *(ggml_tensor **)
          ((long)tVar2.
                 super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                 .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8);
}

Assistant:

ggml_tensor * llm_graph_context::build_inp_pos_bucket_enc() const {
    auto inp = std::make_unique<llm_graph_input_pos_bucket>(hparams);

    auto & cur = inp->pos_bucket;

    cur = ggml_new_tensor_2d(ctx0, GGML_TYPE_I32, n_tokens, n_tokens);
    ggml_set_input(cur);

    res->add_input(std::move(inp));

    return cur;
}